

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O0

void __thiscall bal::GraphMLStreamWriter::write_header(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  Cnf *value_local;
  GraphMLStreamWriter *this_local;
  
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,
                           "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,"<graph id=\"CNF\" edgedefault=\"undirected\">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = StreamWriter<bal::Cnf>::stream(&this->super_StreamWriter<bal::Cnf>);
  poVar1 = std::operator<<(poVar1,
                           "<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void write_header(const Cnf& value) {
            stream() << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>" << std::endl;
            stream() << "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">" << std::endl;
            stream() << "<graph id=\"CNF\" edgedefault=\"undirected\">" << std::endl;
            stream() << "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>" << std::endl;
            stream() << "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>" << std::endl;
        }